

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

TaggedUnionExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::TaggedUnionExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::Expression_const*&,slang::SourceRange>
          (BumpAllocator *this,Type *args,Symbol *args_1,Expression **args_2,SourceRange *args_3)

{
  Expression *pEVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  TaggedUnionExpression *pTVar4;
  
  pTVar4 = (TaggedUnionExpression *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((TaggedUnionExpression *)this->endPtr < pTVar4 + 1) {
    pTVar4 = (TaggedUnionExpression *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pTVar4 + 1);
  }
  pEVar1 = *args_2;
  SVar2 = args_3->startLoc;
  SVar3 = args_3->endLoc;
  (pTVar4->super_Expression).kind = TaggedUnion;
  (pTVar4->super_Expression).type.ptr = args;
  (pTVar4->super_Expression).constant = (ConstantValue *)0x0;
  (pTVar4->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pTVar4->super_Expression).sourceRange.startLoc = SVar2;
  (pTVar4->super_Expression).sourceRange.endLoc = SVar3;
  pTVar4->member = args_1;
  pTVar4->valueExpr = pEVar1;
  return pTVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }